

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  stbi_uc *psVar11;
  stbi_uc *psVar12;
  uchar *puVar13;
  stbi_uc *psVar14;
  uint uVar15;
  int iVar16;
  stbi_uc *unaff_RBX;
  ulong uVar17;
  undefined7 uVar18;
  uint uVar19;
  int iVar20;
  uchar *puVar21;
  uint uVar22;
  ulong unaff_R13;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  uchar raw_data [4];
  uint local_80;
  byte local_78 [4];
  uint local_74;
  uint local_70;
  uint local_6c;
  stbi_uc *local_68;
  undefined8 local_60;
  uint local_54;
  stbi_uc *local_50;
  uint local_48;
  uint local_44;
  ulong local_40;
  uint local_34;
  
  psVar11 = s->img_buffer;
  psVar14 = s->img_buffer_end;
  if (psVar11 < psVar14) {
    s->img_buffer = psVar11 + 1;
    local_60 = (stbi_uc *)
               CONCAT44(local_60._4_4_,(int)CONCAT71((int7)((ulong)psVar11 >> 8),*psVar11));
    psVar11 = psVar11 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_60 = (stbi_uc *)((ulong)local_60._4_4_ << 0x20);
  }
  else {
    unaff_RBX = s->buffer_start;
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)unaff_RBX,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_60 = (stbi_uc *)((ulong)local_60._4_4_ << 0x20);
    }
    else {
      psVar14 = unaff_RBX + iVar8;
      local_60 = (stbi_uc *)
                 CONCAT44(local_60._4_4_,(int)CONCAT71((int7)((ulong)psVar11 >> 8),*unaff_RBX));
    }
    s->img_buffer_end = psVar14;
    psVar11 = s->buffer_start + 1;
    s->img_buffer = psVar11;
  }
  if (psVar11 < psVar14) {
    s->img_buffer = psVar11 + 1;
    bVar1 = *psVar11;
    psVar11 = psVar11 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar1 = 0;
  }
  else {
    unaff_RBX = s->buffer_start;
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)unaff_RBX,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar1 = 0;
    }
    else {
      psVar14 = unaff_RBX + iVar8;
      bVar1 = *unaff_RBX;
    }
    s->img_buffer_end = psVar14;
    psVar11 = s->buffer_start + 1;
    s->img_buffer = psVar11;
  }
  local_34 = req_comp;
  if (psVar11 < psVar14) {
    s->img_buffer = psVar11 + 1;
    bVar2 = *psVar11;
  }
  else if (s->read_from_callbacks == 0) {
    bVar2 = 0;
  }
  else {
    unaff_RBX = s->buffer_start;
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)unaff_RBX,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar2 = 0;
    }
    else {
      psVar14 = unaff_RBX + iVar8;
      bVar2 = *unaff_RBX;
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = s->buffer_start + 1;
  }
  iVar8 = stbi__get16le(s);
  local_44 = stbi__get16le(s);
  psVar14 = s->img_buffer;
  local_68 = (stbi_uc *)CONCAT44(local_68._4_4_,iVar8);
  if (psVar14 < s->img_buffer_end) {
    s->img_buffer = psVar14 + 1;
    uVar17 = CONCAT71((int7)((ulong)unaff_RBX >> 8),*psVar14);
  }
  else if (s->read_from_callbacks == 0) {
    uVar17 = 0;
  }
  else {
    psVar14 = s->buffer_start;
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      psVar11 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      uVar17 = 0;
    }
    else {
      psVar11 = psVar14 + iVar8;
      uVar17 = CONCAT71((int7)((ulong)psVar14 >> 8),*psVar14);
    }
    s->img_buffer_end = psVar11;
    s->img_buffer = s->buffer_start + 1;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  uVar9 = stbi__get16le(s);
  local_74 = stbi__get16le(s);
  psVar11 = s->img_buffer;
  psVar14 = s->img_buffer_end;
  if (psVar11 < psVar14) {
    s->img_buffer = psVar11 + 1;
    local_80 = (uint)CONCAT71((int7)((ulong)psVar11 >> 8),*psVar11);
    psVar11 = psVar11 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_80 = 0;
  }
  else {
    uVar17 = uVar17 & 0xffffffff;
    psVar12 = s->buffer_start;
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar12,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_80 = 0;
    }
    else {
      psVar14 = psVar12 + iVar8;
      local_80 = (uint)CONCAT71((int7)((ulong)psVar11 >> 8),*psVar12);
    }
    s->img_buffer_end = psVar14;
    psVar11 = s->buffer_start + 1;
    s->img_buffer = psVar11;
    unaff_R13 = uVar17;
  }
  if (psVar11 < psVar14) {
    s->img_buffer = psVar11 + 1;
    uVar23 = CONCAT71((int7)(unaff_R13 >> 8),*psVar11);
  }
  else if (s->read_from_callbacks == 0) {
    uVar23 = 0;
  }
  else {
    uVar17 = uVar17 & 0xffffffff;
    psVar14 = s->buffer_start;
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      psVar12 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      uVar15 = 0;
    }
    else {
      psVar12 = psVar14 + iVar8;
      uVar15 = (uint)CONCAT71((int7)((ulong)psVar11 >> 8),*psVar14);
    }
    s->img_buffer_end = psVar12;
    s->img_buffer = s->buffer_start + 1;
    uVar23 = (ulong)uVar15;
  }
  uVar18 = (undefined7)(uVar17 >> 8);
  if (bVar1 == 0) {
    uVar15 = local_80 & 0xff;
    if (0xf < (local_80 & 0xff)) {
      if ((uVar15 == 0x20) || (uVar15 == 0x18)) {
        uVar17 = (ulong)local_80;
        goto LAB_0012c98e;
      }
      if (uVar15 != 0x10) goto LAB_0012c97e;
      uVar15 = bVar2 - 8;
      if (bVar2 < 8) {
        uVar15 = (uint)bVar2;
      }
      if (uVar15 != 3) goto LAB_0012c95a;
      local_6c = (uint)CONCAT71(uVar18,2);
      goto LAB_0012c991;
    }
    if ((local_80 & 0xff) == 8) goto LAB_0012c96c;
    if (uVar15 != 0xf) goto LAB_0012c97e;
LAB_0012c95a:
    local_6c = (uint)CONCAT71(uVar18,3);
    bVar5 = true;
    bVar26 = false;
  }
  else {
    uVar15 = (uint)uVar17 & 0xff;
    if (uVar15 < 0x18) {
      if (uVar15 - 0xf < 2) goto LAB_0012c95a;
      if (uVar15 != 8) goto LAB_0012c97e;
LAB_0012c96c:
      bVar26 = true;
      bVar5 = false;
      local_6c = (uint)CONCAT71(uVar18,1);
    }
    else {
      if ((uVar15 != 0x18) && (uVar15 != 0x20)) {
LAB_0012c97e:
        stbi__g_failure_reason = "bad format";
        return (stbi_uc *)0x0;
      }
LAB_0012c98e:
      local_6c = (uint)CONCAT71((int7)(uVar17 >> 8),(byte)uVar17 >> 3);
LAB_0012c991:
      bVar26 = true;
      bVar5 = false;
    }
  }
  uVar15 = local_6c & 0xff;
  *x = uVar9;
  *y = local_74;
  if (comp != (int *)0x0) {
    *comp = uVar15;
  }
  uVar19 = local_74 * uVar9;
  uVar17 = (ulong)uVar15;
  puVar13 = (uchar *)malloc(uVar17 * uVar19);
  if (puVar13 == (uchar *)0x0) {
LAB_0012cf2a:
    stbi__g_failure_reason = "outofmem";
    return (stbi_uc *)0x0;
  }
  local_48 = (uint)CONCAT71((int7)(uVar23 >> 8),(byte)uVar23 >> 5);
  local_54 = uVar9;
  local_40 = (ulong)uVar19;
  stbi__skip(s,(uint)(byte)local_60);
  uVar9 = local_48;
  if ((bVar2 < 8 && bVar1 == 0) && !bVar5) {
    if (local_74 == 0) goto LAB_0012cefc;
    iVar8 = local_54 * uVar15;
    uVar22 = 0;
    uVar19 = local_74;
    do {
      uVar19 = uVar19 - 1;
      uVar10 = uVar22;
      if ((uVar9 & 1) == 0) {
        uVar10 = uVar19;
      }
      stbi__getn(s,puVar13 + (int)(uVar10 * iVar8),iVar8);
      uVar22 = uVar22 + 1;
    } while (uVar19 != 0);
  }
  else {
    if (bVar1 == 0) {
      local_50 = (stbi_uc *)0x0;
    }
    else {
      stbi__skip(s,(int)local_68);
      uVar9 = local_44;
      uVar19 = local_44 * uVar15;
      psVar14 = (stbi_uc *)malloc((ulong)uVar19);
      if (psVar14 == (stbi_uc *)0x0) {
        free(puVar13);
        goto LAB_0012cf2a;
      }
      local_50 = psVar14;
      if (bVar26) {
        iVar8 = stbi__getn(s,psVar14,uVar19);
        if (iVar8 == 0) {
          free(puVar13);
          free(psVar14);
          stbi__g_failure_reason = "bad palette";
          return (stbi_uc *)0x0;
        }
      }
      else {
        if (uVar15 != 3) {
          __assert_fail("tga_comp == STBI_rgb",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/stb_image.h"
                        ,0x1434,"stbi_uc *stbi__tga_load(stbi__context *, int *, int *, int *, int)"
                       );
        }
        if (uVar9 != 0) {
          psVar14 = psVar14 + 2;
          do {
            uVar19 = stbi__get16le(s);
            psVar14[-2] = (stbi_uc)(((uVar19 >> 10 & 0x1f) * 0xff) / 0x1f);
            psVar14[-1] = (stbi_uc)(((uVar19 >> 5 & 0x1f) * 0xff) / 0x1f);
            *psVar14 = (stbi_uc)(((uVar19 & 0x1f) * 0xff) / 0x1f);
            psVar14 = psVar14 + uVar17;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
      }
    }
    if ((int)local_40 != 0) {
      local_60 = s->buffer_start;
      local_68 = s->buffer_start + 1;
      bVar6 = true;
      uVar23 = 0;
      local_70 = 0;
      iVar8 = 0;
      do {
        psVar14 = local_60;
        if (bVar2 < 8) {
LAB_0012cbeb:
          psVar14 = local_60;
          if (bVar1 == 0) {
            if (!bVar26) {
              if (uVar15 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/stb_image.h"
                              ,0x1465,
                              "stbi_uc *stbi__tga_load(stbi__context *, int *, int *, int *, int)");
              }
              uVar9 = stbi__get16le(s);
              local_78[0] = (byte)(((uVar9 >> 10 & 0x1f) * 0xff) / 0x1f);
              local_78[1] = (byte)(((uVar9 >> 5 & 0x1f) * 0xff) / 0x1f);
              local_78[2] = (byte)(((uVar9 & 0x1f) * 0xff) / 0x1f);
              goto LAB_0012ce0e;
            }
            if ((byte)local_6c != '\0') {
              psVar14 = s->img_buffer;
              psVar11 = s->img_buffer_end;
              uVar24 = 0;
              do {
                psVar12 = local_60;
                if (psVar14 < psVar11) {
                  s->img_buffer = psVar14 + 1;
                  bVar7 = *psVar14;
                  psVar14 = psVar14 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar7 = 0;
                }
                else {
                  iVar16 = (*(s->io).read)(s->io_user_data,(char *)local_60,s->buflen);
                  if (iVar16 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar7 = 0;
                    psVar11 = local_68;
                  }
                  else {
                    bVar7 = *psVar12;
                    psVar11 = psVar12 + iVar16;
                  }
                  s->img_buffer_end = psVar11;
                  s->img_buffer = local_68;
                  psVar14 = local_68;
                }
                local_78[uVar24] = bVar7;
                uVar24 = uVar24 + 1;
              } while (uVar17 != uVar24);
              goto LAB_0012ccda;
            }
          }
          else {
            if ((char)local_80 == '\b') {
              pbVar4 = s->img_buffer;
              if (pbVar4 < s->img_buffer_end) {
                s->img_buffer = pbVar4 + 1;
                uVar9 = (uint)*pbVar4;
              }
              else if (s->read_from_callbacks == 0) {
                uVar9 = 0;
              }
              else {
                iVar16 = (*(s->io).read)(s->io_user_data,(char *)local_60,s->buflen);
                if (iVar16 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  uVar9 = 0;
                  psVar14 = local_68;
                }
                else {
                  uVar9 = (uint)*psVar14;
                  psVar14 = psVar14 + iVar16;
                }
                s->img_buffer_end = psVar14;
                s->img_buffer = local_68;
              }
            }
            else {
              uVar9 = stbi__get16le(s);
            }
            if ((byte)local_6c != '\0') {
              if (local_44 <= uVar9) {
                uVar9 = 0;
              }
              memcpy(local_78,local_50 + uVar9 * uVar15,uVar17);
LAB_0012ce0e:
              memcpy(puVar13 + uVar15 * (int)uVar23,local_78,uVar17);
            }
          }
        }
        else {
          if (iVar8 == 0) {
            pbVar4 = s->img_buffer;
            if (pbVar4 < s->img_buffer_end) {
              s->img_buffer = pbVar4 + 1;
              bVar7 = *pbVar4;
            }
            else if (s->read_from_callbacks == 0) {
              bVar7 = 0;
            }
            else {
              iVar8 = (*(s->io).read)(s->io_user_data,(char *)local_60,s->buflen);
              if (iVar8 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar7 = 0;
                psVar14 = local_68;
              }
              else {
                bVar7 = *psVar14;
                psVar14 = psVar14 + iVar8;
              }
              s->img_buffer_end = psVar14;
              s->img_buffer = local_68;
            }
            iVar8 = (bVar7 & 0x7f) + 1;
            local_70 = (uint)(bVar7 >> 7);
            goto LAB_0012cbeb;
          }
          bVar25 = local_70 != 0;
          local_70 = 1;
          if (!bVar25 || bVar6) {
            local_70 = (uint)bVar25;
            goto LAB_0012cbeb;
          }
LAB_0012ccda:
          if ((byte)local_6c != '\0') goto LAB_0012ce0e;
        }
        iVar8 = iVar8 + -1;
        uVar23 = uVar23 + 1;
        bVar6 = false;
      } while (uVar23 != local_40);
    }
    if ((local_48 & 1) == 0 && local_74 != 0) {
      iVar8 = local_54 * uVar15;
      iVar16 = iVar8 * (local_74 - 1);
      uVar19 = 0;
      uVar9 = 0;
      do {
        if (iVar8 != 0) {
          puVar21 = puVar13;
          iVar20 = iVar8 + 1;
          do {
            uVar3 = puVar21[uVar19];
            puVar21[uVar19] = puVar21[iVar16];
            puVar21[iVar16] = uVar3;
            puVar21 = puVar21 + 1;
            iVar20 = iVar20 + -1;
          } while (1 < iVar20);
        }
        iVar16 = iVar16 - iVar8;
        uVar19 = uVar19 + iVar8;
        bVar26 = uVar9 != local_74 - 1 >> 1;
        uVar9 = uVar9 + 1;
      } while (bVar26);
    }
    if (local_50 != (stbi_uc *)0x0) {
      free(local_50);
    }
  }
  if (((int)local_40 != 0 && 2 < (byte)local_6c) && !bVar5) {
    puVar21 = puVar13 + 2;
    uVar23 = local_40;
    do {
      uVar3 = puVar21[-2];
      puVar21[-2] = *puVar21;
      *puVar21 = uVar3;
      puVar21 = puVar21 + uVar17;
      uVar9 = (int)uVar23 - 1;
      uVar23 = (ulong)uVar9;
    } while (uVar9 != 0);
  }
LAB_0012cefc:
  if (local_34 == 0) {
    return puVar13;
  }
  if (uVar15 != local_34) {
    puVar13 = stbi__convert_format(puVar13,uVar15,local_34,local_54,local_74);
    return puVar13;
  }
  return puVar13;
}

Assistant:

static stbi_uc *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4];
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   tga_data = (unsigned char*)stbi__malloc( (size_t)tga_width * tga_height * tga_comp );
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc( tga_palette_len * tga_comp );
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   //   OK, done
   return tga_data;
}